

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.c++
# Opt level: O2

String * __thiscall kj::ReadableFile::readAllText(String *__return_storage_ptr__,ReadableFile *this)

{
  size_t sVar1;
  int iVar2;
  undefined4 extraout_var;
  char *pcVar3;
  char *pcVar4;
  ulong uVar5;
  char *pcVar6;
  Array<char> aAStack_48 [2];
  
  (*(this->super_FsNode)._vptr_FsNode[2])(aAStack_48);
  heapString(__return_storage_ptr__,aAStack_48[0].size_);
  pcVar6 = (char *)(__return_storage_ptr__->content).size_;
  pcVar4 = pcVar6;
  if (pcVar6 != (char *)0x0) {
    pcVar4 = (__return_storage_ptr__->content).ptr;
  }
  pcVar3 = pcVar6 + -1;
  if (pcVar6 == (char *)0x0) {
    pcVar3 = (char *)0x0;
  }
  iVar2 = (*(this->super_FsNode)._vptr_FsNode[6])(this,0,pcVar4,pcVar3);
  sVar1 = (__return_storage_ptr__->content).size_;
  uVar5 = 0;
  if (sVar1 != 0) {
    uVar5 = sVar1 - 1;
  }
  if (CONCAT44(extraout_var,iVar2) < uVar5) {
    if (sVar1 == 0) {
      pcVar6 = "";
    }
    else {
      pcVar6 = (__return_storage_ptr__->content).ptr;
    }
    heapString((String *)aAStack_48,pcVar6,CONCAT44(extraout_var,iVar2));
    Array<char>::operator=(&__return_storage_ptr__->content,aAStack_48);
    Array<char>::~Array(aAStack_48);
  }
  return __return_storage_ptr__;
}

Assistant:

String ReadableFile::readAllText() const {
  String result = heapString(stat().size);
  size_t n = read(0, result.asBytes());
  if (n < result.size()) {
    // Apparently file was truncated concurrently. Reduce to new size to match.
    result = heapString(result.first(n));
  }
  return result;
}